

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tinyxml2.cpp
# Opt level: O0

char * __thiscall tinyxml2::XMLUnknown::ParseDeep(XMLUnknown *this,char *p,StrPair *param_2)

{
  char *pcVar1;
  char *start;
  StrPair *param_2_local;
  char *p_local;
  XMLUnknown *this_local;
  
  pcVar1 = StrPair::ParseText(&(this->super_XMLNode)._value,p,">",2);
  if (pcVar1 == (char *)0x0) {
    XMLDocument::SetError((this->super_XMLNode)._document,XML_ERROR_PARSING_UNKNOWN,p,(char *)0x0);
  }
  return pcVar1;
}

Assistant:

char* XMLUnknown::ParseDeep( char* p, StrPair* )
{
    // Unknown parses as text.
    const char* start = p;

    p = _value.ParseText( p, ">", StrPair::NEEDS_NEWLINE_NORMALIZATION );
    if ( !p ) {
        _document->SetError( XML_ERROR_PARSING_UNKNOWN, start, 0 );
    }
    return p;
}